

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void buildFixItLine(string *CaretLine,string *FixItLine,ArrayRef<llvm::SMFixIt> FixIts,
                   ArrayRef<char> SourceLine)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  iterator __first;
  iterator __last;
  char *__last_00;
  char local_12d;
  int local_12c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_128;
  uint LastCol;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  char *local_118;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  uint local_dc;
  undefined1 auStack_d8 [4];
  uint LastColumnModified;
  size_t local_d0;
  StringRef local_c8;
  uint local_b8;
  uint local_b4;
  uint HintCol;
  uint FirstCol;
  SMRange R;
  StringRef local_90;
  iterator local_80;
  iterator E;
  iterator I;
  size_t PrevHintEndCol;
  char *LineEnd;
  char *LineStart;
  string *FixItLine_local;
  string *CaretLine_local;
  ArrayRef<char> SourceLine_local;
  ArrayRef<llvm::SMFixIt> FixIts_local;
  
  SourceLine_local.Length = (size_type)FixIts.Data;
  SourceLine_local.Data = (char *)SourceLine.Length;
  CaretLine_local = (string *)SourceLine.Data;
  LineStart = (char *)FixItLine;
  FixItLine_local = CaretLine;
  bVar2 = llvm::ArrayRef<llvm::SMFixIt>::empty((ArrayRef<llvm::SMFixIt> *)&SourceLine_local.Length);
  if (!bVar2) {
    LineEnd = llvm::ArrayRef<char>::begin((ArrayRef<char> *)&CaretLine_local);
    PrevHintEndCol = (size_t)llvm::ArrayRef<char>::end((ArrayRef<char> *)&CaretLine_local);
    I = (iterator)0x0;
    E = llvm::ArrayRef<llvm::SMFixIt>::begin((ArrayRef<llvm::SMFixIt> *)&SourceLine_local.Length);
    local_80 = llvm::ArrayRef<llvm::SMFixIt>::end
                         ((ArrayRef<llvm::SMFixIt> *)&SourceLine_local.Length);
    for (; E != local_80; E = E + 1) {
      local_90 = llvm::SMFixIt::getText(E);
      strlen("\n\r\t");
      sVar4 = llvm::StringRef::find_first_of(&local_90,stack0xffffffffffffff60,0);
      if (sVar4 == 0xffffffffffffffff) {
        _HintCol = llvm::SMFixIt::getRange(E);
        pcVar5 = llvm::SMLoc::getPointer((SMLoc *)&HintCol);
        if ((pcVar5 <= PrevHintEndCol) &&
           (pcVar5 = llvm::SMLoc::getPointer(&R.Start), LineEnd <= pcVar5)) {
          pcVar5 = llvm::SMLoc::getPointer((SMLoc *)&HintCol);
          if (pcVar5 < LineEnd) {
            local_b4 = 0;
          }
          else {
            pcVar5 = llvm::SMLoc::getPointer((SMLoc *)&HintCol);
            local_b4 = (int)pcVar5 - (int)LineEnd;
          }
          local_b8 = local_b4;
          if ((iterator)(ulong)local_b4 < I) {
            local_b8 = (int)I + 1;
          }
          local_c8 = llvm::SMFixIt::getText(E);
          iVar3 = llvm::sys::locale::columnWidth(local_c8);
          _auStack_d8 = llvm::SMFixIt::getText(E);
          uVar1 = local_b8;
          if ((long)iVar3 != local_d0) {
            __assert_fail("(size_t)sys::locale::columnWidth(I->getText()) == I->getText().size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                          ,0x141,
                          "void buildFixItLine(std::string &, std::string &, ArrayRef<SMFixIt>, ArrayRef<char>)"
                         );
          }
          local_f0 = llvm::SMFixIt::getText(E);
          local_dc = uVar1 + (int)local_f0.Length;
          uVar6 = (ulong)local_dc;
          uVar7 = std::__cxx11::string::size();
          if (uVar7 < uVar6) {
            std::__cxx11::string::resize((ulong)LineStart,(char)local_dc);
          }
          local_100 = llvm::SMFixIt::getText(E);
          __first = llvm::StringRef::begin(&local_100);
          local_110 = llvm::SMFixIt::getText(E);
          __last = llvm::StringRef::end(&local_110);
          local_120._M_current = (char *)std::__cxx11::string::begin();
          local_118 = (char *)__gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+(&local_120,(ulong)local_b8);
          _Stack_128 = std::
                       copy<char_const*,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                 (__first,__last,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_118);
          I = (iterator)(ulong)local_dc;
          pcVar5 = llvm::SMLoc::getPointer(&R.Start);
          if (pcVar5 < PrevHintEndCol) {
            pcVar5 = llvm::SMLoc::getPointer(&R.Start);
            local_12c = (int)pcVar5 - (int)LineEnd;
          }
          else {
            local_12c = (int)PrevHintEndCol - (int)LineEnd;
          }
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)FixItLine_local);
          __last_00 = (char *)std::__cxx11::string::operator[]((ulong)FixItLine_local);
          local_12d = '~';
          std::fill<char*,char>(pcVar5,__last_00,&local_12d);
        }
      }
    }
  }
  return;
}

Assistant:

static void buildFixItLine(std::string &CaretLine, std::string &FixItLine,
                           ArrayRef<SMFixIt> FixIts, ArrayRef<char> SourceLine){
  if (FixIts.empty())
    return;

  const char *LineStart = SourceLine.begin();
  const char *LineEnd = SourceLine.end();

  size_t PrevHintEndCol = 0;

  for (ArrayRef<SMFixIt>::iterator I = FixIts.begin(), E = FixIts.end();
       I != E; ++I) {
    // If the fixit contains a newline or tab, ignore it.
    if (I->getText().find_first_of("\n\r\t") != StringRef::npos)
      continue;

    SMRange R = I->getRange();

    // If the line doesn't contain any part of the range, then ignore it.
    if (R.Start.getPointer() > LineEnd || R.End.getPointer() < LineStart)
      continue;

    // Translate from SMLoc to column.
    // Ignore pieces of the range that go onto other lines.
    // FIXME: Handle multibyte characters in the source line.
    unsigned FirstCol;
    if (R.Start.getPointer() < LineStart)
      FirstCol = 0;
    else
      FirstCol = R.Start.getPointer() - LineStart;

    // If we inserted a long previous hint, push this one forwards, and add
    // an extra space to show that this is not part of the previous
    // completion. This is sort of the best we can do when two hints appear
    // to overlap.
    //
    // Note that if this hint is located immediately after the previous
    // hint, no space will be added, since the location is more important.
    unsigned HintCol = FirstCol;
    if (HintCol < PrevHintEndCol)
      HintCol = PrevHintEndCol + 1;

    // FIXME: This assertion is intended to catch unintended use of multibyte
    // characters in fixits. If we decide to do this, we'll have to track
    // separate byte widths for the source and fixit lines.
    assert((size_t)sys::locale::columnWidth(I->getText()) ==
           I->getText().size());

    // This relies on one byte per column in our fixit hints.
    unsigned LastColumnModified = HintCol + I->getText().size();
    if (LastColumnModified > FixItLine.size())
      FixItLine.resize(LastColumnModified, ' ');

    std::copy(I->getText().begin(), I->getText().end(),
              FixItLine.begin() + HintCol);

    PrevHintEndCol = LastColumnModified;

    // For replacements, mark the removal range with '~'.
    // FIXME: Handle multibyte characters in the source line.
    unsigned LastCol;
    if (R.End.getPointer() >= LineEnd)
      LastCol = LineEnd - LineStart;
    else
      LastCol = R.End.getPointer() - LineStart;

    std::fill(&CaretLine[FirstCol], &CaretLine[LastCol], '~');
  }
}